

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

int cuddHashTableResize(DdHashTable *hash)

{
  uint uVar1;
  DdHashItem **__ptr;
  DdHashItem *pDVar2;
  DdHashItem *pDVar3;
  int extraout_EAX;
  DdHashItem **ppDVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  __ptr = hash->bucket;
  uVar8 = hash->numBuckets;
  uVar10 = (ulong)uVar8;
  ppDVar4 = (DdHashItem **)calloc(1,(long)(int)(uVar8 * 2) << 3);
  if (ppDVar4 == (DdHashItem **)0x0) {
    hash->maxsize = hash->maxsize << 1;
  }
  else {
    hash->bucket = ppDVar4;
    hash->numBuckets = uVar8 * 2;
    uVar1 = hash->keysize;
    iVar6 = hash->shift + -1;
    hash->shift = iVar6;
    hash->maxsize = hash->maxsize << 1;
    bVar5 = (byte)iVar6;
    if ((ulong)uVar1 == 1) {
      if (0 < (int)uVar8) {
        uVar7 = 0;
        do {
          pDVar3 = __ptr[uVar7];
          while (pDVar3 != (DdHashItem *)0x0) {
            pDVar2 = pDVar3->next;
            uVar8 = (((uint)pDVar3->key[0] & 1) +
                    *(int *)(((ulong)pDVar3->key[0] & 0xfffffffffffffffe) + 0x20) * 2) * 0x7c45abd6
                    >> (bVar5 & 0x1f);
            pDVar3->next = ppDVar4[uVar8];
            ppDVar4[uVar8] = pDVar3;
            pDVar3 = pDVar2;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar10);
      }
    }
    else if (uVar1 == 2) {
      if (0 < (int)uVar8) {
        uVar7 = 0;
        do {
          pDVar3 = __ptr[uVar7];
          while (pDVar3 != (DdHashItem *)0x0) {
            pDVar2 = pDVar3->next;
            uVar8 = (((uint)pDVar3[1].next & 1) +
                     *(int *)(((ulong)pDVar3[1].next & 0xfffffffffffffffe) + 0x20) * 2 +
                    (((uint)pDVar3->key[0] & 1) +
                    *(int *)(((ulong)pDVar3->key[0] & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                    0x40f1f9 >> (bVar5 & 0x1f);
            pDVar3->next = ppDVar4[uVar8];
            ppDVar4[uVar8] = pDVar3;
            pDVar3 = pDVar2;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar10);
      }
    }
    else if (uVar1 == 3) {
      if (0 < (int)uVar8) {
        uVar7 = 0;
        do {
          pDVar3 = __ptr[uVar7];
          while (pDVar3 != (DdHashItem *)0x0) {
            pDVar2 = pDVar3->next;
            uVar8 = (((uint)pDVar3[1].count & 1) +
                     *(int *)((pDVar3[1].count & 0xfffffffffffffffeU) + 0x20) * 2 +
                    (((uint)pDVar3->key[0] & 1) +
                     *(int *)(((ulong)pDVar3->key[0] & 0xfffffffffffffffe) + 0x20) * 2 +
                    ((uint)pDVar3[1].next & 1) +
                    *(int *)(((ulong)pDVar3[1].next & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                    0x40f1f9 >> (bVar5 & 0x1f);
            pDVar3->next = ppDVar4[uVar8];
            ppDVar4[uVar8] = pDVar3;
            pDVar3 = pDVar2;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar10);
      }
    }
    else if (0 < (int)uVar8) {
      uVar7 = 0;
      do {
        pDVar3 = __ptr[uVar7];
        while (pDVar3 != (DdHashItem *)0x0) {
          uVar8 = *(int *)pDVar3->key * 0x40f1f9;
          if (1 < uVar1) {
            lVar9 = 0;
            do {
              uVar8 = uVar8 * 0xc00005 + *(int *)(pDVar3[1].key + lVar9 + -3);
              lVar9 = lVar9 + 1;
            } while ((ulong)uVar1 - 1 != lVar9);
          }
          pDVar2 = pDVar3->next;
          uVar8 = uVar8 >> (bVar5 & 0x1f);
          pDVar3->next = ppDVar4[uVar8];
          ppDVar4[uVar8] = pDVar3;
          pDVar3 = pDVar2;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar10);
    }
    if (__ptr != (DdHashItem **)0x0) {
      free(__ptr);
      return extraout_EAX;
    }
  }
  return (int)ppDVar4;
}

Assistant:

static int
cuddHashTableResize(
  DdHashTable * hash)
{
    int j;
    unsigned int posn;
    DdHashItem *item;
    DdHashItem *next;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    DdNode **key;
    int numBuckets;
    DdHashItem **buckets;
    DdHashItem **oldBuckets = hash->bucket;
#ifdef __osf__
#pragma pointer_size restore
#endif
    int shift;
    int oldNumBuckets = hash->numBuckets;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    /* Compute the new size of the table. */
    numBuckets = oldNumBuckets << 1;
    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    buckets = ABC_ALLOC(DdHashItem *, numBuckets);
    MMoutOfMemory = saveHandler;
    if (buckets == NULL) {
        hash->maxsize <<= 1;
        return(1);
    }

    hash->bucket = buckets;
    hash->numBuckets = numBuckets;
    shift = --(hash->shift);
    hash->maxsize <<= 1;
    memset(buckets, 0, numBuckets * sizeof(DdHashItem *));
#ifdef __osf__
#pragma pointer_size restore
#endif
    if (hash->keysize == 1) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash2(cuddF2L(key[0]), cuddF2L(key[0]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else if (hash->keysize == 2) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash2(cuddF2L(key[0]), cuddF2L(key[1]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else if (hash->keysize == 3) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash3(cuddF2L(key[0]), cuddF2L(key[1]), cuddF2L(key[2]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                posn = ddLCHash(item->key, hash->keysize, shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    }
    ABC_FREE(oldBuckets);
    return(1);

}